

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

int __thiscall ON_PolyEdgeCurve::FindTrim(ON_PolyEdgeCurve *this,ON_BrepTrim *trim)

{
  int iVar1;
  ON_PolyEdgeSegment *this_00;
  ON_BrepTrim *pOVar2;
  ON_PolyEdgeSegment *segment;
  int local_20;
  int count;
  int i;
  int rc;
  ON_BrepTrim *trim_local;
  ON_PolyEdgeCurve *this_local;
  
  if (trim != (ON_BrepTrim *)0x0) {
    iVar1 = SegmentCount(this);
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      this_00 = SegmentCurve(this,local_20);
      if ((this_00 != (ON_PolyEdgeSegment *)0x0) &&
         (pOVar2 = ON_PolyEdgeSegment::BrepTrim(this_00), trim == pOVar2)) {
        return local_20;
      }
    }
  }
  return -1;
}

Assistant:

int ON_PolyEdgeCurve::FindTrim( const ON_BrepTrim* trim) const
{
  int rc = -1;
  if ( 0 != trim )
  {
    int i, count = SegmentCount();
    for( i = 0; i < count; i++)
    {
      ON_PolyEdgeSegment* segment = SegmentCurve(i);
      if ( 0 != segment && trim == segment->BrepTrim() )
      {
        rc = i;
        break;
      }
    }
  }
  return rc;
}